

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_for.hpp
# Opt level: O0

void Omega_h::
     for_each<Omega_h::IntIterator,Omega_h::average_field(Omega_h::Mesh*,int,Omega_h::Read<int>,int,Omega_h::Read<double>)::__0>
               (IntIterator first,IntIterator last,type *f)

{
  __0 local_90 [8];
  type f2;
  type *f_local;
  IntIterator last_local;
  IntIterator first_local;
  
  if (first.i < last.i) {
    entering_parallel = 1;
    f2.out.shared_alloc_.direct_ptr = f;
    f_local._0_4_ = last.i;
    f_local._4_4_ = first.i;
    average_field(Omega_h::Mesh*,int,Omega_h::Read<int>,int,Omega_h::Read<double>)::$_0::__0
              (local_90,f);
    entering_parallel = 0;
    for (; _last_local = &f_local, f_local._4_4_ != f_local._0_4_; f_local._4_4_ = f_local._4_4_ + 1
        ) {
      std::
      remove_reference<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.cpp:830:12)_&>
      ::type::operator()(local_90,f_local._4_4_);
    }
    average_field(Omega_h::Mesh*,int,Omega_h::Read<int>,int,Omega_h::Read<double>)::$_0::~__0
              (local_90);
  }
  return;
}

Assistant:

void for_each(InputIterator first, InputIterator last, UnaryFunction&& f) {
  if (first >= last) return;
  Omega_h::entering_parallel = true;
  auto const f2 = std::move(f);
  Omega_h::entering_parallel = false;
#if defined(OMEGA_H_USE_OPENMP)
  LO const n = last - first;
#pragma omp parallel for
  for (LO i = 0; i < n; ++i) {
    f2(first[i]);
  }
#else
  for (; first != last; ++first) {
    f2(*first);
  }
#endif
}